

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O2

Vector3 * __thiscall
COLLADABU::Math::Quaternion::operator*(Vector3 *__return_storage_ptr__,Quaternion *this,Vector3 *v)

{
  undefined1 auVar1 [16];
  double dVar2;
  Vector3 *kSum;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  anon_union_24_2_77b307f9_for_Vector3_0 local_58;
  double local_40;
  double local_38;
  double dStack_30;
  
  local_58.field_0.z = this->z;
  local_58.field_0.x = this->x;
  local_58.field_0.y = this->y;
  Vector3::crossProduct((Vector3 *)&local_58.field_0,v);
  dVar4 = dStack_30 * local_58.field_0.y - local_58.field_0.z * local_38;
  dVar5 = local_40 * local_58.field_0.z - local_58.field_0.x * dStack_30;
  dVar3 = local_58.field_0.x * local_38 - local_58.field_0.y * local_40;
  dVar6 = this->w + this->w;
  dVar2 = (v->field_0).field_0.y + dVar6 * local_38 + dVar5 + dVar5;
  dVar5 = (v->field_0).field_0.z;
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = (v->field_0).field_0.x + dVar6 * local_40 + dVar4 + dVar4;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])&__return_storage_ptr__->field_0 = auVar1;
  (__return_storage_ptr__->field_0).field_0.z = dStack_30 * dVar6 + dVar5 + dVar3 + dVar3;
  return __return_storage_ptr__;
}

Assistant:

Vector3 Quaternion::operator* ( const Vector3& v ) const
        {
            // nVidia SDK implementation
            Vector3 uv, uuv;
            Vector3 qvec( x, y, z );
            uv = qvec.crossProduct( v );
            uuv = qvec.crossProduct( uv );
            uv *= ( 2.0f * w );
            uuv *= 2.0f;

            return v + uv + uuv;

        }